

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiclock.cpp
# Opt level: O2

bool choosePort<RtMidiIn>(RtMidiIn *rtmidi,char *dir)

{
  uint uVar1;
  ostream *poVar2;
  uint local_78;
  allocator<char> local_71;
  string local_70 [32];
  string portName;
  
  portName._M_dataplus._M_p = (pointer)&portName.field_2;
  portName._M_string_length = 0;
  portName.field_2._M_local_buf[0] = '\0';
  local_78 = 0;
  uVar1 = (**(code **)(*(long *)rtmidi + 0x10))();
  if (uVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No ");
    poVar2 = std::operator<<(poVar2,dir);
    poVar2 = std::operator<<(poVar2," ports available!");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    if (uVar1 == 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\nOpening ");
      (**(code **)(*(long *)rtmidi + 0x18))(local_70,rtmidi,0);
      poVar2 = std::operator<<(poVar2,local_70);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(local_70);
    }
    else {
      for (local_78 = 0; local_78 < uVar1; local_78 = local_78 + 1) {
        (**(code **)(*(long *)rtmidi + 0x18))(local_70,rtmidi,local_78);
        std::__cxx11::string::operator=((string *)&portName,local_70);
        std::__cxx11::string::~string(local_70);
        poVar2 = std::operator<<((ostream *)&std::cout,"  ");
        poVar2 = std::operator<<(poVar2,dir);
        poVar2 = std::operator<<(poVar2," port #");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2,": ");
        poVar2 = std::operator<<(poVar2,(string *)&portName);
        std::operator<<(poVar2,'\n');
      }
      do {
        std::operator<<((ostream *)&std::cout,"\nChoose a port number: ");
        std::istream::_M_extract<unsigned_int>((uint *)&std::cin);
      } while (uVar1 <= local_78);
    }
    std::operator<<((ostream *)&std::cout,"\n");
    std::__cxx11::string::string<std::allocator<char>>(local_70,"RtMidi Input",&local_71);
    (*(code *)**(undefined8 **)rtmidi)(rtmidi,local_78,local_70);
    std::__cxx11::string::~string(local_70);
  }
  std::__cxx11::string::~string((string *)&portName);
  return uVar1 != 0;
}

Assistant:

bool choosePort( RT *rtmidi, const char *dir )
{
  std::string portName;
  unsigned int i = 0, nPorts = rtmidi->getPortCount();
  if ( nPorts == 0 ) {
    std::cout << "No " << dir << " ports available!" << std::endl;
    return false;
  }

  if ( nPorts == 1 ) {
    std::cout << "\nOpening " << rtmidi->getPortName() << std::endl;
  }
  else {
    for ( i=0; i<nPorts; i++ ) {
      portName = rtmidi->getPortName(i);
      std::cout << "  " << dir << " port #" << i << ": " << portName << '\n';
    }

    do {
      std::cout << "\nChoose a port number: ";
      std::cin >> i;
    } while ( i >= nPorts );
  }

  std::cout << "\n";
  rtmidi->openPort( i );

  return true;
}